

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O1

void __thiscall
PrimitiveDisplayer::drawableWithGLRotation
          (PrimitiveDisplayer *this,Drawable *drawable,float rotation,Vec2d *coords)

{
  undefined8 *puVar1;
  Vec2d *pVVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  pVVar2 = (Vec2d *)(**(code **)(*(long *)(&drawable->field_0x0 + *(long *)((long)*drawable + -0x50)
                                          ) + 0x30))
                              (&drawable->field_0x0 + *(long *)((long)*drawable + -0x50));
  pVVar2 = Vec2d::getScale(pVVar2,this->pixelsPerSquare);
  glPushMatrix();
  fVar4 = Vec2d::getX(coords);
  fVar6 = this->pixelsPerSquare;
  fVar5 = Vec2d::getY(coords);
  glTranslatef(fVar4 * fVar6,(20.0 - fVar5) * this->pixelsPerSquare,0);
  fVar6 = Vec2d::getX(pVVar2);
  fVar4 = Vec2d::getY(pVVar2);
  glTranslatef(fVar6,-fVar4,0);
  glRotatef(rotation,0,0,0x3f800000);
  fVar6 = Vec2d::getX(pVVar2);
  fVar4 = Vec2d::getY(pVVar2);
  glTranslatef(-fVar6,fVar4,0);
  puVar3 = (undefined8 *)(**(code **)((long)*drawable + 0x40))(drawable);
  puVar1 = (undefined8 *)puVar3[1];
  for (puVar3 = (undefined8 *)*puVar3; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    drawQuad(this,(Quad *)*puVar3);
  }
  glPopMatrix();
  operator_delete(pVVar2);
  return;
}

Assistant:

void PrimitiveDisplayer::drawableWithGLRotation(Drawable* drawable, float rotation, Vec2d* coords) {
    Vec2d* pivotPoint = drawable->getPivotPoint()->getScale(pixelsPerSquare);
    
    glPushMatrix();
    // move to object coords - invert the y coordinate
    glTranslatef(coords->getX() * pixelsPerSquare, (20 - coords->getY()) * pixelsPerSquare, 0.f);
    
    // perform the rotation by moving to the pivot point (again inverting y), rotating, then moving back.
    glTranslatef(pivotPoint->getX(), -pivotPoint->getY(), 0.f);
    glRotatef(rotation, 0.f, 0.f, 1.f);
    glTranslatef(-pivotPoint->getX(), pivotPoint->getY(), 0.f);
    
    // draw the quads with no rotation
    for (auto quad : *drawable->getQuads()) {
        drawQuad(quad);
    }
    glPopMatrix();
    
    delete pivotPoint;
    pivotPoint = nullptr;
    coords = nullptr;
}